

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O3

void __thiscall
WienerCpp::WienerCpp
          (WienerCpp *this,Time *time,double w,double n,double lambda,double n_rc,double lambda_rc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_88;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  string local_40;
  
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  local_68 = w;
  local_60 = lambda;
  local_58 = n;
  local_50 = n_rc;
  local_48 = lambda_rc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Wiener Process","");
  Wiener::Wiener(&this->super_Wiener,time,&local_88,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_Wiener = &PTR__WienerCpp_0015e910;
  *(undefined ***)&(this->super_Wiener).field_0x60 = &PTR__WienerCpp_0015e9d0;
  *(undefined ***)&(this->super_Wiener).field_0x78 = &PTR__WienerCpp_0015ea18;
  this->condW = local_68;
  this->condLambda = local_60;
  this->condN = local_58;
  this->condCoincWidth = local_50;
  this->condCoincRate = local_48;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"number-of-processes","");
  Parametric::addParameter((Parametric *)this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"single-weight","");
  Parametric::addParameter((Parametric *)this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"single-rate","");
  Parametric::addParameter((Parametric *)this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"coincidence-width","");
  Parametric::addParameter((Parametric *)this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"coincidence-rate","");
  Parametric::addParameter((Parametric *)this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*(long *)&this->super_Wiener + 0x68))(this);
  return;
}

Assistant:

WienerCpp::WienerCpp( Time *time, double w, double n, double lambda, double n_rc, double lambda_rc ) : Wiener( time ) 
{
	condW = w;
	condLambda = lambda;
	condN = n;
	condCoincWidth = n_rc;
	condCoincRate = lambda_rc;
	addParameter("number-of-processes");
	addParameter("single-weight");
	addParameter("single-rate");
	addParameter("coincidence-width");
	addParameter("coincidence-rate");
	init();
}